

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O3

void printoption(Curl_easy *data,char *direction,int cmd,int option)

{
  curl_trc_feat *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (((data->set).field_0x89f & 0x40) != 0) {
    switch(cmd) {
    case 0xfb:
      pcVar2 = "WILL";
      break;
    case 0xfc:
      pcVar2 = "WONT";
      break;
    case 0xfd:
      pcVar2 = "DO";
      break;
    default:
      pcVar2 = "DONT";
      break;
    case 0xff:
      pcVar1 = (data->state).feat;
      if (0x13 < option - 0xecU) {
        if ((pcVar1 != (curl_trc_feat *)0x0) && (pcVar1->log_level < 1)) {
          return;
        }
        Curl_infof(data,"%s IAC %d",direction,(ulong)(uint)option);
        return;
      }
      if ((pcVar1 != (curl_trc_feat *)0x0) && (pcVar1->log_level < 1)) {
        return;
      }
      Curl_infof(data,"%s IAC %s",direction,telnetcmds[option - 0xecU]);
      return;
    }
    if (option < 0x28) {
      pcVar3 = telnetoptions[option];
    }
    else {
      if (option != 0xff) {
        pcVar1 = (data->state).feat;
        if ((pcVar1 != (curl_trc_feat *)0x0) && (pcVar1->log_level < 1)) {
          return;
        }
        Curl_infof(data,"%s %s %d",direction,pcVar2);
        return;
      }
      pcVar3 = "EXOPL";
    }
    pcVar1 = (data->state).feat;
    if ((pcVar1 == (curl_trc_feat *)0x0) || (0 < pcVar1->log_level)) {
      Curl_infof(data,"%s %s %s",direction,pcVar2,pcVar3);
      return;
    }
  }
  return;
}

Assistant:

static void printoption(struct Curl_easy *data,
                        const char *direction, int cmd, int option)
{
  if(data->set.verbose) {
    if(cmd == CURL_IAC) {
      if(CURL_TELCMD_OK(option))
        infof(data, "%s IAC %s", direction, CURL_TELCMD(option));
      else
        infof(data, "%s IAC %d", direction, option);
    }
    else {
      const char *fmt = (cmd == CURL_WILL) ? "WILL" :
                        (cmd == CURL_WONT) ? "WONT" :
                        (cmd == CURL_DO) ? "DO" :
                        (cmd == CURL_DONT) ? "DONT" : 0;
      if(fmt) {
        const char *opt;
        if(CURL_TELOPT_OK(option))
          opt = CURL_TELOPT(option);
        else if(option == CURL_TELOPT_EXOPL)
          opt = "EXOPL";
        else
          opt = NULL;

        if(opt)
          infof(data, "%s %s %s", direction, fmt, opt);
        else
          infof(data, "%s %s %d", direction, fmt, option);
      }
      else
        infof(data, "%s %d %d", direction, cmd, option);
    }
  }
}